

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O2

optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ImprovesFeerateDiagram_abi_cxx11_
            (optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,CTxMemPool *pool,setEntries *direct_conflicts,
            setEntries *all_conflicts,CAmount replacement_fees,int64_t replacement_vsize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer pFVar4;
  partial_ordering pVar5;
  T *pTVar6;
  Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  *result;
  long in_FS_OFFSET;
  Span<const_FeeFrac> chunks0;
  Span<const_FeeFrac> chunks1;
  Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  chunk_results;
  bilingual_str local_d0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Variant_storage<false,_bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CTxMemPool::CalculateChunksForRBF
            ((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
              *)&local_68,pool,replacement_fees,replacement_vsize,direct_conflicts,all_conflicts);
  if (local_68._M_index == '\x01') {
    pTVar6 = util::
             Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             ::value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                      *)&local_68);
    pFVar2 = (pTVar6->second).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar3 = (pTVar6->second).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar6 = util::
             Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             ::value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                      *)&local_68);
    pFVar4 = (pTVar6->first).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start;
    chunks1.m_size =
         (long)(pTVar6->first).super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pFVar4 >> 4;
    chunks0.m_size = (long)pFVar3 - (long)pFVar2 >> 4;
    chunks0.m_data = pFVar2;
    chunks1.m_data = pFVar4;
    pVar5 = CompareChunks(chunks0,chunks1);
    if (pVar5._M_value == '\x01') {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged = false;
    }
    else {
      local_d0.original._M_dataplus._M_p._0_4_ = 1;
      local_d0.original._M_string_length = 0x6a91d7;
      std::_Optional_payload_base<std::pair<DiagramCheckError,std::__cxx11::string>>::
      _Optional_payload_base<std::pair<DiagramCheckError,char_const*>>
                ((_Optional_payload_base<std::pair<DiagramCheckError,std::__cxx11::string>> *)
                 __return_storage_ptr__);
    }
  }
  else {
    util::
    ErrorString<std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
              (&local_d0,(util *)&local_68,result);
    local_90._0_4_ = UNCALCULABLE;
    local_88._M_p = (pointer)&local_78;
    paVar1 = &local_d0.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.original._M_dataplus._M_p == paVar1) {
      local_78._8_8_ = local_d0.original.field_2._8_8_;
    }
    else {
      local_88._M_p = local_d0.original._M_dataplus._M_p;
    }
    local_80 = (char *)local_d0.original._M_string_length;
    local_d0.original._M_string_length = 0;
    local_d0.original.field_2._M_local_buf[0] = '\0';
    local_d0.original._M_dataplus._M_p = (pointer)paVar1;
    std::
    optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              (__return_storage_ptr__,
               (pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_90);
    std::__cxx11::string::~string((string *)&local_88);
    bilingual_str::~bilingual_str(&local_d0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  ::~_Variant_storage(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<DiagramCheckError, std::string>> ImprovesFeerateDiagram(CTxMemPool& pool,
                                                const CTxMemPool::setEntries& direct_conflicts,
                                                const CTxMemPool::setEntries& all_conflicts,
                                                CAmount replacement_fees,
                                                int64_t replacement_vsize)
{
    // Require that the replacement strictly improves the mempool's feerate diagram.
    const auto chunk_results{pool.CalculateChunksForRBF(replacement_fees, replacement_vsize, direct_conflicts, all_conflicts)};

    if (!chunk_results.has_value()) {
        return std::make_pair(DiagramCheckError::UNCALCULABLE, util::ErrorString(chunk_results).original);
    }

    if (!std::is_gt(CompareChunks(chunk_results.value().second, chunk_results.value().first))) {
        return std::make_pair(DiagramCheckError::FAILURE, "insufficient feerate: does not improve feerate diagram");
    }
    return std::nullopt;
}